

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OverlapGraph.cpp
# Opt level: O0

int __thiscall dgrminer::OverlapGraph::computeSupport(OverlapGraph *this)

{
  pointer *this_00;
  bool bVar1;
  size_type sVar2;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  iterator __i;
  reference piVar3;
  ulong uVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  iterator __first;
  iterator __last;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> __result;
  undefined1 local_1d8 [8];
  vector<int,_std::allocator<int>_> max_clique_data;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1a0;
  const_iterator local_198;
  key_type local_190;
  int local_18c;
  int i;
  int result;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  undefined1 local_128 [8];
  set<int,_std::less<int>,_std::allocator<int>_> inverseResult;
  pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *adjacencyList;
  iterator __end1;
  iterator __begin1;
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *__range1;
  value_type_conflict local_c4;
  undefined1 local_c0 [8];
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  nodeList;
  CGraphIO gio;
  OverlapGraph *this_local;
  
  gio.m_vd_Values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  CGraphIO::CGraphIO((CGraphIO *)&nodeList._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
         *)local_c0);
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)
                     &gio.m_vi_OrderedVertices.super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  local_c4 = (value_type_conflict)sVar2;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)&gio.m_d_AverageVertexDegree,&local_c4);
  __end1 = std::
           map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
           ::begin(&this->adjacencyLists);
  adjacencyList =
       (pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
       std::
       map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
       ::end(&this->adjacencyLists);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&adjacencyList);
    if (!bVar1) break;
    inverseResult._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 ::operator*(&__end1);
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_128);
    __first1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(&this->vertices);
    __last1 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->vertices);
    __first2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          (inverseResult._M_t._M_impl.super__Rb_tree_header._M_node_count + 8));
    __last2 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)
                         (inverseResult._M_t._M_impl.super__Rb_tree_header._M_node_count + 8));
    __i = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)local_128);
    __result = std::inserter<std::set<int,std::less<int>,std::allocator<int>>>
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)local_128,__i);
    std::
    set_difference<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>>
              ((_Rb_tree_const_iterator<int>)__first1._M_node,
               (_Rb_tree_const_iterator<int>)__last1._M_node,
               (_Rb_tree_const_iterator<int>)__first2._M_node,
               (_Rb_tree_const_iterator<int>)__last2._M_node,__result);
    __end2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)local_128);
    _i = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)local_128);
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&i);
      if (!bVar1) break;
      piVar3 = std::_Rb_tree_const_iterator<int>::operator*(&__end2);
      local_18c = *piVar3;
      if (local_18c < *(int *)inverseResult._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        pmVar6 = std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)local_c0,
                              (key_type *)
                              inverseResult._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::vector<int,_std::allocator<int>_>::push_back(pmVar6,&local_18c);
        pmVar6 = std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)local_c0,&local_18c);
        std::vector<int,_std::allocator<int>_>::push_back
                  (pmVar6,(value_type_conflict *)
                          inverseResult._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
      std::_Rb_tree_const_iterator<int>::operator++(&__end2);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_128);
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>::
    operator++(&__end1);
  }
  local_190 = 0;
  while( true ) {
    uVar4 = (ulong)local_190;
    sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::size(&this->vertices);
    if (sVar5 <= uVar4) break;
    this_00 = &gio.m_vi_OrderedVertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_1a0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)this_00);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_198,
               &local_1a0);
    pmVar6 = std::
             map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                           *)local_c0,&local_190);
    __first = std::vector<int,_std::allocator<int>_>::begin(pmVar6);
    pmVar6 = std::
             map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                           *)local_c0,&local_190);
    __last = std::vector<int,_std::allocator<int>_>::end(pmVar6);
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)this_00,local_198,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current
               ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current
              );
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)
                       &gio.m_vi_OrderedVertices.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    max_clique_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = (undefined4)sVar2;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&gio.m_d_AverageVertexDegree,
               (value_type_conflict *)
               ((long)&max_clique_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4));
    local_190 = local_190 + 1;
  }
  CGraphIO::CalculateVertexDegrees
            ((CGraphIO *)&nodeList._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((this->heuristic & 1U) == 0) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_1d8);
    this_local._4_4_ =
         maxClique((CGraphIO *)&nodeList._M_t._M_impl.super__Rb_tree_header._M_node_count,0,
                   (vector<int,_std::allocator<int>_> *)local_1d8);
    max_clique_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 1;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1d8);
  }
  else {
    this_local._4_4_ =
         maxCliqueHeu((CGraphIO *)&nodeList._M_t._M_impl.super__Rb_tree_header._M_node_count);
    max_clique_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 1;
  }
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *)local_c0);
  CGraphIO::~CGraphIO((CGraphIO *)&nodeList._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return this_local._4_4_;
}

Assistant:

int OverlapGraph::computeSupport() {
		// create inverse graph and calculate maximum clique
		CGraphIO gio;
	  	map<int,vector<int> > nodeList;

		gio.m_vi_Vertices.push_back(gio.m_vi_Edges.size());

		for (auto const &adjacencyList : adjacencyLists) {
		  	std::set<int> inverseResult;

		  	std::set_difference(
		  		vertices.begin(),
			    vertices.end(),
			    adjacencyList.second.begin(),
			    adjacencyList.second.end(),
			    std::inserter(inverseResult, inverseResult.end())
		  	);

		  	for (auto result : inverseResult) {
			  	if (result < adjacencyList.first) {
				  	nodeList[adjacencyList.first].push_back(result);
				  	nodeList[result].push_back(adjacencyList.first);
			  	}
		  	}
		}

	  	for(int i=0; i < vertices.size(); ++i) {
		  	gio.m_vi_Edges.insert(gio.m_vi_Edges.end(),nodeList[i].begin(),nodeList[i].end());
		  	gio.m_vi_Vertices.push_back(gio.m_vi_Edges.size());
		}

		gio.CalculateVertexDegrees();

		if (heuristic){
		  	return maxCliqueHeu(gio);
		}

		std::vector<int> max_clique_data;
		return maxClique(gio, 0, max_clique_data);
	}